

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

SUNErrCode
N_VWrmsNormMaskVectorArray_ManyVector(int nvec,N_Vector *X,N_Vector *W,N_Vector id,sunrealtype *nrm)

{
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  undefined8 uVar1;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_40;
  undefined8 local_38;
  
  for (local_38 = 0; local_38 < in_EDI; local_38 = local_38 + 1) {
    uVar1 = N_VWSqrSumMaskLocal(*(undefined8 *)(in_RSI + local_38 * 8),
                                *(undefined8 *)(in_RDX + local_38 * 8),in_RCX);
    *(undefined8 *)(in_R8 + local_38 * 8) = uVar1;
  }
  for (local_38 = 0; local_38 < in_EDI; local_38 = local_38 + 1) {
    if (0.0 < *(double *)(in_R8 + local_38 * 8) /
              (double)*(long *)(**(long **)(in_RSI + local_38 * 8) + 8)) {
      local_40 = sqrt(*(double *)(in_R8 + local_38 * 8) /
                      (double)*(long *)(**(long **)(in_RSI + local_38 * 8) + 8));
    }
    else {
      local_40 = 0.0;
    }
    *(double *)(in_R8 + local_38 * 8) = local_40;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VWrmsNormMaskVectorArray)(int nvec, N_Vector* X,
                                                N_Vector* W, N_Vector id,
                                                sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);

  sunindextype i;

  SUNAssert(nvec > 0, SUN_ERR_ARG_OUTOFRANGE);

  /* call N_VWSqrSumMaskLocal for each (X[i],W[i]) pair */
  for (i = 0; i < nvec; i++)
  {
    nrm[i] = N_VWSqrSumMaskLocal(X[i], W[i], id);
    SUNCheckLastErr();
  }

  /* accumulate totals */
#ifdef MANYVECTOR_BUILD_WITH_MPI
  if (MANYVECTOR_COMM(X[0]) != MPI_COMM_NULL)
  {
    SUNCheckMPICall(MPI_Allreduce(MPI_IN_PLACE, nrm, nvec, MPI_SUNREALTYPE,
                                  MPI_SUM, MANYVECTOR_COMM(X[0])));
  }
#endif

  /* finish off WRMS norms and return */
  for (i = 0; i < nvec; i++)
  {
    nrm[i] = SUNRsqrt(nrm[i] / (MANYVECTOR_GLOBLENGTH(X[i])));
  }

  return SUN_SUCCESS;
}